

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  RunResult RVar11;
  RunResult RVar12;
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  Simd<unsigned_char,_(unsigned_char)__b_> local_10;
  
  RVar11 = Load<wabt::interp::Simd<unsigned_char,(unsigned_char)8>>(this,instr,&local_10,out_trap);
  RVar12 = Trap;
  if (RVar11 == Ok) {
    auVar1._8_6_ = 0;
    auVar1[0] = local_10.v[0];
    auVar1[1] = local_10.v[1];
    auVar1[2] = local_10.v[2];
    auVar1[3] = local_10.v[3];
    auVar1[4] = local_10.v[4];
    auVar1[5] = local_10.v[5];
    auVar1[6] = local_10.v[6];
    auVar1[7] = local_10.v[7];
    auVar1[0xe] = local_10.v[7];
    auVar2._8_4_ = 0;
    auVar2[0] = local_10.v[0];
    auVar2[1] = local_10.v[1];
    auVar2[2] = local_10.v[2];
    auVar2[3] = local_10.v[3];
    auVar2[4] = local_10.v[4];
    auVar2[5] = local_10.v[5];
    auVar2[6] = local_10.v[6];
    auVar2[7] = local_10.v[7];
    auVar2[0xc] = local_10.v[6];
    auVar2._13_2_ = auVar1._13_2_;
    auVar3._8_4_ = 0;
    auVar3[0] = local_10.v[0];
    auVar3[1] = local_10.v[1];
    auVar3[2] = local_10.v[2];
    auVar3[3] = local_10.v[3];
    auVar3[4] = local_10.v[4];
    auVar3[5] = local_10.v[5];
    auVar3[6] = local_10.v[6];
    auVar3[7] = local_10.v[7];
    auVar3._12_3_ = auVar2._12_3_;
    auVar4._8_2_ = 0;
    auVar4[0] = local_10.v[0];
    auVar4[1] = local_10.v[1];
    auVar4[2] = local_10.v[2];
    auVar4[3] = local_10.v[3];
    auVar4[4] = local_10.v[4];
    auVar4[5] = local_10.v[5];
    auVar4[6] = local_10.v[6];
    auVar4[7] = local_10.v[7];
    auVar4[10] = local_10.v[5];
    auVar4._11_4_ = auVar3._11_4_;
    auVar5._8_2_ = 0;
    auVar5[0] = local_10.v[0];
    auVar5[1] = local_10.v[1];
    auVar5[2] = local_10.v[2];
    auVar5[3] = local_10.v[3];
    auVar5[4] = local_10.v[4];
    auVar5[5] = local_10.v[5];
    auVar5[6] = local_10.v[6];
    auVar5[7] = local_10.v[7];
    auVar5._10_5_ = auVar4._10_5_;
    auVar6[8] = local_10.v[4];
    auVar6[0] = local_10.v[0];
    auVar6[1] = local_10.v[1];
    auVar6[2] = local_10.v[2];
    auVar6[3] = local_10.v[3];
    auVar6[4] = local_10.v[4];
    auVar6[5] = local_10.v[5];
    auVar6[6] = local_10.v[6];
    auVar6[7] = local_10.v[7];
    auVar6._9_6_ = auVar5._9_6_;
    auVar8._7_8_ = 0;
    auVar8._0_7_ = auVar6._8_7_;
    auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
    auVar9[0] = local_10.v[3];
    auVar9._9_6_ = 0;
    auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
    auVar10[0] = local_10.v[2];
    auVar10._11_4_ = 0;
    auVar7._3_12_ = SUB1512(auVar10 << 0x20,3);
    auVar7[2] = local_10.v[1];
    auVar7[1] = 0;
    auVar7[0] = local_10.v[0];
    value.v._0_8_ = auVar7._0_8_;
    value.v._8_7_ = auVar6._8_7_;
    value.v[7]._1_1_ = 0;
    Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
    RVar12 = Ok;
  }
  return RVar12;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}